

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O1

int loader_preload(lua_State *L)

{
  int iVar1;
  char *k;
  
  k = luaL_checklstring(L,1,(size_t *)0x0);
  lua_getfield(L,-0x2711,"preload");
  iVar1 = lua_type(L,-1);
  if (iVar1 != 5) {
    luaL_error(L,"\'package.preload\' must be a table");
  }
  lua_getfield(L,-1,k);
  iVar1 = lua_type(L,-1);
  if (iVar1 == 0) {
    lua_pushfstring(L,"\n\tno field package.preload[\'%s\']",k);
  }
  return 1;
}

Assistant:

static int loader_preload (lua_State *L) {
  const char *name = luaL_checkstring(L, 1);
  lua_getfield(L, LUA_ENVIRONINDEX, "preload");
  if (!lua_istable(L, -1))
    luaL_error(L, LUA_QL("package.preload") " must be a table");
  lua_getfield(L, -1, name);
  if (lua_isnil(L, -1))  /* not found? */
    lua_pushfstring(L, "\n\tno field package.preload['%s']", name);
  return 1;
}